

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O2

void __thiscall wasm::PassRunner::runPass(PassRunner *this,Pass *pass)

{
  int iVar1;
  size_type sVar2;
  AfterEffectModuleChecker *this_00;
  pointer __p;
  __uniq_ptr_impl<wasm::AfterEffectModuleChecker,_std::default_delete<wasm::AfterEffectModuleChecker>_>
  local_38;
  __uniq_ptr_impl<wasm::AfterEffectModuleChecker,_std::default_delete<wasm::AfterEffectModuleChecker>_>
  local_30;
  unique_ptr<wasm::AfterEffectModuleChecker,_std::default_delete<wasm::AfterEffectModuleChecker>_>
  checker;
  
  iVar1 = (*pass->_vptr_Pass[4])(pass);
  if ((char)iVar1 != '\0') {
    __assert_fail("!pass->isFunctionParallel()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/pass.cpp"
                  ,0x3ba,"void wasm::PassRunner::runPass(Pass *)");
  }
  sVar2 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&(this->options).passesToSkip._M_h,&pass->name);
  if (sVar2 != 0) {
    std::__detail::
    _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert((_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)&this->skippedPasses,&pass->name);
    return;
  }
  local_30._M_t.
  super__Tuple_impl<0UL,_wasm::AfterEffectModuleChecker_*,_std::default_delete<wasm::AfterEffectModuleChecker>_>
  .super__Head_base<0UL,_wasm::AfterEffectModuleChecker_*,_false>._M_head_impl =
       (tuple<wasm::AfterEffectModuleChecker_*,_std::default_delete<wasm::AfterEffectModuleChecker>_>
        )(_Tuple_impl<0UL,_wasm::AfterEffectModuleChecker_*,_std::default_delete<wasm::AfterEffectModuleChecker>_>
          )0x0;
  iVar1 = getPassDebug();
  if (iVar1 != 0) {
    this_00 = (AfterEffectModuleChecker *)operator_new(0x28);
    AfterEffectModuleChecker::AfterEffectModuleChecker(this_00,this->wasm);
    local_38._M_t.
    super__Tuple_impl<0UL,_wasm::AfterEffectModuleChecker_*,_std::default_delete<wasm::AfterEffectModuleChecker>_>
    .super__Head_base<0UL,_wasm::AfterEffectModuleChecker_*,_false>._M_head_impl =
         (tuple<wasm::AfterEffectModuleChecker_*,_std::default_delete<wasm::AfterEffectModuleChecker>_>
          )(_Tuple_impl<0UL,_wasm::AfterEffectModuleChecker_*,_std::default_delete<wasm::AfterEffectModuleChecker>_>
            )0x0;
    std::
    __uniq_ptr_impl<wasm::AfterEffectModuleChecker,_std::default_delete<wasm::AfterEffectModuleChecker>_>
    ::reset(&local_30,this_00);
    std::
    unique_ptr<wasm::AfterEffectModuleChecker,_std::default_delete<wasm::AfterEffectModuleChecker>_>
    ::~unique_ptr((unique_ptr<wasm::AfterEffectModuleChecker,_std::default_delete<wasm::AfterEffectModuleChecker>_>
                   *)&local_38);
  }
  if (pass->runner == (PassRunner *)0x0) {
    Pass::setPassRunner(pass,this);
    (*pass->_vptr_Pass[2])(pass,this->wasm);
    handleAfterEffects(this,pass,(Function *)0x0);
    iVar1 = getPassDebug();
    if (iVar1 != 0) {
      AfterEffectModuleChecker::check
                ((AfterEffectModuleChecker *)
                 local_30._M_t.
                 super__Tuple_impl<0UL,_wasm::AfterEffectModuleChecker_*,_std::default_delete<wasm::AfterEffectModuleChecker>_>
                 .super__Head_base<0UL,_wasm::AfterEffectModuleChecker_*,_false>._M_head_impl);
    }
    std::
    unique_ptr<wasm::AfterEffectModuleChecker,_std::default_delete<wasm::AfterEffectModuleChecker>_>
    ::~unique_ptr((unique_ptr<wasm::AfterEffectModuleChecker,_std::default_delete<wasm::AfterEffectModuleChecker>_>
                   *)&local_30);
    return;
  }
  __assert_fail("!pass->getPassRunner()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/pass.cpp"
                ,0x3c8,"void wasm::PassRunner::runPass(Pass *)");
}

Assistant:

void PassRunner::runPass(Pass* pass) {
  assert(!pass->isFunctionParallel());

  if (options.passesToSkip.count(pass->name)) {
    skippedPasses.insert(pass->name);
    return;
  }

  std::unique_ptr<AfterEffectModuleChecker> checker;
  if (getPassDebug()) {
    checker = std::unique_ptr<AfterEffectModuleChecker>(
      new AfterEffectModuleChecker(wasm));
  }
  // Passes can only be run once and we deliberately do not clear the pass
  // runner after running the pass, so there must not already be a runner here.
  assert(!pass->getPassRunner());
  pass->setPassRunner(this);
  pass->run(wasm);
  handleAfterEffects(pass);
  if (getPassDebug()) {
    checker->check();
  }
}